

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_net * oonf_layer2_net_add(char *ifname)

{
  long lVar1;
  oonf_layer2_metadata *poVar2;
  char *local_48;
  oonf_layer2_neighbor_index local_40;
  oonf_layer2_network_index local_3c;
  oonf_layer2_neighbor_index neighidx;
  oonf_layer2_network_index netidx;
  oonf_layer2_net *l2net;
  char *ifname_local;
  
  if (ifname == (char *)0x0) {
    ifname_local = (char *)0x0;
  }
  else {
    lVar1 = avl_find(&_oonf_layer2_net_tree,ifname);
    if (lVar1 == 0) {
      local_48 = (char *)0x0;
    }
    else {
      local_48 = (char *)(lVar1 + -0x7a0);
    }
    if (local_48 == (char *)0x0) {
      ifname_local = (char *)oonf_class_malloc(&_l2network_class);
      if (ifname_local == (char *)0x0) {
        ifname_local = (char *)0x0;
      }
      else {
        strscpy(ifname_local,ifname,0x10);
        *(char **)(ifname_local + 0x7c8) = ifname_local;
        avl_insert(&_oonf_layer2_net_tree,ifname_local + 0x7a0);
        avl_init(ifname_local + 0x90,oonf_layer2_avlcmp_neigh_key,0);
        avl_init(ifname_local + 0xb8,avl_comp_netaddr,0);
        avl_init(ifname_local + 0xe0,avl_comp_netaddr,1);
        *(char **)(ifname_local + 0x58) = ifname_local;
        os_interface_linux_add((os_interface_listener *)(ifname_local + 0x58));
        for (local_3c = OONF_LAYER2_NET_FREQUENCY_1; local_3c < OONF_LAYER2_NET_COUNT;
            local_3c = local_3c + OONF_LAYER2_NET_FREQUENCY_2) {
          poVar2 = oonf_layer2_net_metadata_get(local_3c);
          *(oonf_layer2_metadata **)(ifname_local + (ulong)local_3c * 0x28 + 0x128) = poVar2;
        }
        for (local_40 = OONF_LAYER2_NEIGH_TX_SIGNAL; local_40 < OONF_LAYER2_NEIGH_COUNT;
            local_40 = local_40 + OONF_LAYER2_NEIGH_RX_SIGNAL) {
          poVar2 = oonf_layer2_neigh_metadata_get(local_40);
          *(oonf_layer2_metadata **)(ifname_local + (ulong)local_40 * 0x28 + 0x3a8) = poVar2;
        }
        oonf_class_event(&_l2network_class,ifname_local,OONF_OBJECT_ADDED);
      }
    }
    else {
      ifname_local = local_48;
    }
  }
  return (oonf_layer2_net *)ifname_local;
}

Assistant:

struct oonf_layer2_net *
oonf_layer2_net_add(const char *ifname) {
  struct oonf_layer2_net *l2net;
  enum oonf_layer2_network_index netidx;
  enum oonf_layer2_neighbor_index neighidx;

  if (!ifname) {
    return NULL;
  }

  l2net = avl_find_element(&_oonf_layer2_net_tree, ifname, l2net, _node);
  if (l2net) {
    return l2net;
  }

  l2net = oonf_class_malloc(&_l2network_class);
  if (!l2net) {
    return NULL;
  }

  /* initialize key */
  strscpy(l2net->name, ifname, sizeof(l2net->name));

  /* add to global l2net tree */
  l2net->_node.key = l2net->name;
  avl_insert(&_oonf_layer2_net_tree, &l2net->_node);

  /* initialize tree of neighbors, ips and proxies */
  avl_init(&l2net->neighbors, oonf_layer2_avlcmp_neigh_key, false);
  avl_init(&l2net->local_peer_ips, avl_comp_netaddr, false);
  avl_init(&l2net->remote_neighbor_ips, avl_comp_netaddr, true);

  /* initialize interface listener */
  l2net->if_listener.name = l2net->name;
  os_interface_add(&l2net->if_listener);

  /* initialize data sections */
  for (netidx=0; netidx<OONF_LAYER2_NET_COUNT; netidx++) {
    l2net->data[netidx]._meta = oonf_layer2_net_metadata_get(netidx);
  }
  for (neighidx=0; neighidx<OONF_LAYER2_NEIGH_COUNT; neighidx++) {
    l2net->neighdata[neighidx]._meta = oonf_layer2_neigh_metadata_get(neighidx);
  }

  oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_ADDED);

  return l2net;
}